

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract(data_view *data,DataType baseType,char *val)

{
  char cVar1;
  long lVar2;
  invalid_argument *this;
  double dVar3;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view val_00;
  vector<double,_std::allocator<double>_> vec;
  undefined8 local_20;
  
  switch(baseType) {
  case HELICS_DOUBLE:
    dVar3 = ValueConverter<double>::interpret(data);
    goto LAB_0020c60d;
  case HELICS_INT:
  case HELICS_TIME:
    lVar2 = ValueConverter<long>::interpret(data);
    *val = (char)lVar2;
    break;
  case HELICS_COMPLEX:
    ValueConverter<std::complex<double>_>::interpret(data);
    if ((in_XMM1_Qa != 0.0) || (dVar3 = extraout_XMM0_Qa, NAN(in_XMM1_Qa))) {
      dVar3 = std::abs<double>((complex<double> *)&vec);
    }
LAB_0020c60d:
    cVar1 = (char)(int)dVar3;
LAB_0020c611:
    *val = cVar1;
    break;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret(&vec,data);
    if ((long)vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      dVar3 = *vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      dVar3 = vectorNorm(&vec);
    }
    *val = (char)(int)dVar3;
    CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&vec);
    break;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&vec,data);
    if ((long)vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == 0x10) {
      if ((vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[1] != 0.0) ||
         (NAN(vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[1]))) {
        dVar3 = std::abs<double>((complex<double> *)
                                 vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
      }
      else {
        dVar3 = *vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
    else {
      dVar3 = vectorNorm((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                         &vec);
    }
    *val = (char)(int)dVar3;
    CLI::std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::
    ~_Vector_base((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&vec
                 );
    break;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)&vec,data);
    if (NAN((double)local_20)) {
      if (vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish == (pointer)0x1) {
        cVar1 = *(char *)vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
      }
      else {
        val_00._M_str =
             (char *)vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        val_00._M_len =
             (size_t)vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        local_20 = getDoubleFromString(val_00);
        if (((double)local_20 != -1e+49) || (NAN((double)local_20))) goto LAB_0020c6d3;
        cVar1 = *(char *)vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
      }
    }
    else {
LAB_0020c6d3:
      cVar1 = (char)(int)(double)local_20;
    }
    *val = cVar1;
    std::__cxx11::string::~string((string *)&vec);
    break;
  case HELICS_BOOL:
    bVar4 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret(data);
    *val = *bVar4._M_str;
    break;
  default:
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)&vec,(helics *)data,(data_view *)val);
      valueExtract((defV *)&vec,val);
LAB_0020c66d:
      CLI::std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)&vec);
      return;
    }
    if (baseType == HELICS_ANY) {
      vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      valueExtract(data,HELICS_ANY,(defV *)&vec);
      valueExtract((defV *)&vec,val);
      goto LAB_0020c66d;
    }
    if ((baseType == HELICS_CUSTOM) || (baseType == HELICS_MULTI)) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"unrecognized helics type");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    bVar4 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret(data);
    if (bVar4._M_len != 1) {
      dVar3 = getDoubleFromString(bVar4);
      if ((dVar3 != -1e+49) || (NAN(dVar3))) goto LAB_0020c60d;
    }
    cVar1 = *bVar4._M_str;
    goto LAB_0020c611;
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, char& val)
{
    switch (baseType) {
        case DataType::HELICS_ANY: {
            defV val_dv;
            valueExtract(data, baseType, val_dv);
            valueExtract(val_dv, val);
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            auto value = ValueConverter<std::string_view>::interpret(data);
            if (value.size() == 1) {
                val = value[0];
            } else {
                const double dval = getDoubleFromString(value);
                if (dval != invalidDouble) {
                    val = static_cast<char>(dval);
                } else {
                    val = value[0];
                }
            }
        }

        break;
        case DataType::HELICS_BOOL:
            val = ValueConverter<std::string_view>::interpret(data)[0];
            break;
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                if (npval.name.size() == 1) {
                    val = npval.name[0];
                } else {
                    const double value = getDoubleFromString(npval.name);
                    if (value != invalidDouble) {
                        val = static_cast<char>(value);
                    } else {
                        val = npval.name[0];
                    }
                }
            } else {
                val = static_cast<char>(npval.value);
            }
            break;
        }
        case DataType::HELICS_DOUBLE: {
            val = static_cast<char>(ValueConverter<double>::interpret(data));
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            auto intVal = ValueConverter<int64_t>::interpret(data);
            val = static_cast<char>(intVal);
            break;
        }

        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            val = static_cast<char>((vec.size() == 1) ? vec[0] : vectorNorm(vec));
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val = static_cast<char>((cval.imag() == 0.0) ? cval.real() : std::abs(cval));
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val = static_cast<char>(
                (cvec.size() == 1) ?
                    ((cvec[0].imag() == 0.0) ? cvec[0].real() : std::abs(cvec[0])) :
                    vectorNorm(cvec));
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
        case DataType::HELICS_CUSTOM:
        case DataType::HELICS_MULTI:
            throw(std::invalid_argument("unrecognized helics type"));
    }
}